

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::SetSize(Window *this,int width,int height)

{
  if ((this->width == width) && (this->height == height)) {
    DestroyIfBadBounds(this);
    return;
  }
  this->width = width;
  this->height = height;
  RecreateForUpdatedDimensions(this);
  return;
}

Assistant:

void Window::SetSize(int width, int height) {
    ASSERT_MAIN_THREAD();

    if (this->width != width || this->height != height) {
        this->width = width;
        this->height = height;
        this->RecreateForUpdatedDimensions();
    }
    else {
        this->DestroyIfBadBounds();
    }
}